

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

void ReaderConnCloseHandler(CManager cm,CMConnection ClosedConn,void *client_data)

{
  void *__ptr;
  SstStream in_RDX;
  CMConnection in_RSI;
  int i;
  int FailedPeerRank;
  SstStream Stream;
  char *tmpstr;
  uint local_30;
  uint local_2c;
  
  if (_perfstubs_initialized == 1) {
    if (ReaderConnCloseHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_reader.c"
                                          ,"ReaderConnCloseHandler",0xe0);
      ReaderConnCloseHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(ReaderConnCloseHandler::timer);
  }
  local_2c = 0xffffffff;
  pthread_mutex_lock((pthread_mutex_t *)&in_RDX->DataLock);
  CP_verbose(in_RDX,PerRankVerbose,"Reader-side close handler invoked\n");
  if ((in_RDX->Status == Destroyed) || (in_RDX->ConnectionsToWriter == (CP_PeerConnection *)0x0)) {
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDX->DataLock);
  }
  else {
    for (local_30 = 0; (int)local_30 < in_RDX->WriterCohortSize; local_30 = local_30 + 1) {
      if (in_RDX->ConnectionsToWriter[(int)local_30].CMconn == in_RSI) {
        local_2c = local_30;
      }
    }
    if (in_RDX->Status == Established) {
      if ((in_RDX->WriterConfigParams->CPCommPattern == 0) && (in_RDX->Rank != 0)) {
        CP_verbose(in_RDX,PerRankVerbose,
                   "Reader-side Rank received a connection-close event during normal operations, but might be part of shutdown  Don\'t change stream status.\n"
                  );
      }
      else {
        CP_verbose(in_RDX,PerRankVerbose,
                   "Reader-side Rank received a connection-close event during normal operations, peer likely failed\n"
                  );
        if (local_2c == in_RDX->FailureContactRank) {
          in_RDX->Status = PeerFailed;
          pthread_cond_signal((pthread_cond_t *)&in_RDX->DataCondition);
        }
      }
      CP_verbose(in_RDX,PerRankVerbose,
                 "The close was for connection to writer peer %d, notifying DP\n",(ulong)local_2c);
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDX->DataLock);
      (*in_RDX->DP_Interface->notifyConnFailure)(&Svcs,in_RDX->DP_Stream,local_2c);
    }
    else if (in_RDX->Status == PeerClosed) {
      CP_verbose(in_RDX,PerRankVerbose,
                 "Reader-side Rank received a connection-close event after close, not unexpected\n")
      ;
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDX->DataLock);
    }
    else if (in_RDX->Status == PeerFailed) {
      CP_verbose(in_RDX,PerRankVerbose,
                 "Reader-side Rank received a connection-close event after PeerFailed, already notified DP \n"
                );
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDX->DataLock);
    }
    else {
      CP_verbose(in_RDX,CriticalVerbose,"Got an unexpected connection close event\n");
      CP_verbose(in_RDX,PerStepVerbose,
                 "Reader-side Rank received a connection-close event in unexpected status %s\n",
                 SSTStreamStatusStr[in_RDX->Status]);
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDX->DataLock);
    }
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(ReaderConnCloseHandler::timer);
    }
  }
  return;
}

Assistant:

extern void ReaderConnCloseHandler(CManager cm, CMConnection ClosedConn, void *client_data)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream = (SstStream)client_data;
    int FailedPeerRank = -1;
    STREAM_MUTEX_LOCK(Stream);
    CP_verbose(Stream, PerRankVerbose, "Reader-side close handler invoked\n");
    if ((Stream->Status == Destroyed) || (!Stream->ConnectionsToWriter))
    {
        STREAM_MUTEX_UNLOCK(Stream);
        return;
    }
    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        if (Stream->ConnectionsToWriter[i].CMconn == ClosedConn)
        {
            FailedPeerRank = i;
        }
    }

    if (Stream->Status == Established)
    {
        if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank != 0))
        {
            CP_verbose(Stream, PerRankVerbose,
                       "Reader-side Rank received a "
                       "connection-close event during normal "
                       "operations, but might be part of shutdown  "
                       "Don't change stream status.\n");
            /* if this happens and *is* a failure, we'll get the status from
             * rank 0 later */
        }
        else
        {
            /*
             * tag our reader instance as failed, IFF this came from someone we
             * should have gotten a CLOSE from. I.E. a reverse peer
             */
            CP_verbose(Stream, PerRankVerbose,
                       "Reader-side Rank received a "
                       "connection-close event during normal "
                       "operations, peer likely failed\n");
            if (FailedPeerRank == Stream->FailureContactRank)
            {
                Stream->Status = PeerFailed;
                STREAM_CONDITION_SIGNAL(Stream);
            }
        }
        CP_verbose(Stream, PerRankVerbose,
                   "The close was for connection to writer peer %d, notifying DP\n",
                   FailedPeerRank);
        STREAM_MUTEX_UNLOCK(Stream);
        /* notify DP of failure.  This should terminate any waits currently
         * pending in the DP for that rank */
        Stream->DP_Interface->notifyConnFailure(&Svcs, Stream->DP_Stream, FailedPeerRank);
    }
    else if (Stream->Status == PeerClosed)
    {
        /* ignore this.  We expect a close after the connection is marked closed
         */
        CP_verbose(Stream, PerRankVerbose,
                   "Reader-side Rank received a "
                   "connection-close event after close, "
                   "not unexpected\n");
        STREAM_MUTEX_UNLOCK(Stream);
        // Don't notify DP, because this is part of normal shutdown and we don't
        // want to kill pending reads
    }
    else if (Stream->Status == PeerFailed)
    {
        CP_verbose(Stream, PerRankVerbose,
                   "Reader-side Rank received a "
                   "connection-close event after PeerFailed, already notified DP \n");
        // Don't notify DP, because we already have */
        STREAM_MUTEX_UNLOCK(Stream);
    }
    else
    {
        CP_verbose(Stream, CriticalVerbose, "Got an unexpected connection close event\n");
        CP_verbose(Stream, PerStepVerbose,
                   "Reader-side Rank received a "
                   "connection-close event in unexpected "
                   "status %s\n",
                   SSTStreamStatusStr[Stream->Status]);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}